

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O0

Storyboard * __thiscall
ApprovalTests::Storyboard::addFrame(Storyboard *this,string *title,string *frame)

{
  ostream *poVar1;
  string *in_RDX;
  string *in_RSI;
  Storyboard *in_RDI;
  
  if ((in_RDI->addNewLineBeforeNextFrame_ & 1U) != 0) {
    ::std::operator<<((ostream *)&in_RDI->field_0x10,'\n');
    in_RDI->addNewLineBeforeNextFrame_ = false;
  }
  poVar1 = ::std::operator<<((ostream *)&in_RDI->field_0x10,in_RSI);
  ::std::operator<<(poVar1,":\n");
  poVar1 = ::std::operator<<((ostream *)&in_RDI->field_0x10,in_RDX);
  ::std::operator<<(poVar1,"\n\n");
  in_RDI->frameCount_ = in_RDI->frameCount_ + 1;
  return in_RDI;
}

Assistant:

Storyboard& Storyboard::addFrame(const std::string& title, const std::string& frame)
    {
        if (addNewLineBeforeNextFrame_)
        {
            output_ << '\n';
            addNewLineBeforeNextFrame_ = false;
        }
        output_ << title << ":\n";
        output_ << frame << "\n\n";
        frameCount_ += 1;
        return *this;
    }